

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray-png.hxx
# Opt level: O0

void andres::png::save<unsigned_char>
               (string *fileName,Marray<unsigned_char,_std::allocator<unsigned_long>_> *in)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  runtime_error *prVar4;
  CoordinateOrder *pCVar5;
  size_t *begin;
  size_t *end;
  char *__filename;
  FILE *__stream;
  long lVar6;
  long lVar7;
  __jmp_buf_tag *p_Var8;
  reference puVar9;
  reference ppuVar10;
  uchar **ppuVar11;
  png_byte bit_depth;
  ulong uStack_100;
  png_byte color_type;
  size_t y;
  undefined1 local_f0 [8];
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> rowPointers;
  png_uint_32 height;
  png_uint_32 width;
  png_infop info_ptr;
  png_structp png_ptr;
  FILE *file;
  allocator<unsigned_char> local_72;
  uchar local_71;
  undefined1 local_70 [8];
  Marray<unsigned_char,_std::allocator<unsigned_long>_> tmp;
  Marray<unsigned_char,_std::allocator<unsigned_long>_> *in_local;
  string *fileName_local;
  
  sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                    (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
  if (sVar3 != 2) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"not implemented for Marray of dimension other than 2.");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                    (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,0);
  uVar1 = std::numeric_limits<unsigned_int>::max();
  if (sVar3 <= uVar1) {
    sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                      (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,1);
    uVar1 = std::numeric_limits<unsigned_int>::max();
    if (sVar3 <= uVar1) {
      pCVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                         (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
      if (*pCVar5 == FirstMajorOrder) {
        begin = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shapeBegin
                          (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
        end = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shapeEnd
                        (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
        local_71 = '\x01';
        std::allocator<unsigned_char>::allocator(&local_72);
        Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long_const*>
                  ((Marray<unsigned_char,std::allocator<unsigned_long>> *)local_70,begin,end,
                   &local_71,&defaultOrder,&local_72);
        std::allocator<unsigned_char>::~allocator(&local_72);
        View<unsigned_char,_false,_std::allocator<unsigned_long>_>::View
                  ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)&file,
                   (View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_70);
        View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator=
                  ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)&file,
                   &in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
        View<unsigned_char,_false,_std::allocator<unsigned_long>_>::~View
                  ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)&file);
        pCVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                           ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_70);
        if (*pCVar5 != LastMajorOrder) {
          __assert_fail("tmp.coordinateOrder() == LastMajorOrder",
                        "/workspace/llm4binary/github/license_c_cmakelists/bjoern-andres[P]marray/include/andres/marray-png.hxx"
                        ,0x83,
                        "void andres::png::save(const std::string &, const Marray<unsigned char> &)"
                       );
        }
        save<unsigned_char>(fileName,(Marray<unsigned_char,_std::allocator<unsigned_long>_> *)
                                     local_70);
        Marray<unsigned_char,_std::allocator<unsigned_long>_>::~Marray
                  ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)local_70);
      }
      else {
        pCVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                           (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
        if (*pCVar5 != LastMajorOrder) {
          __assert_fail("in.coordinateOrder() == LastMajorOrder",
                        "/workspace/llm4binary/github/license_c_cmakelists/bjoern-andres[P]marray/include/andres/marray-png.hxx"
                        ,0x88,
                        "void andres::png::save(const std::string &, const Marray<unsigned char> &)"
                       );
        }
        __filename = (char *)std::__cxx11::string::c_str();
        __stream = fopen(__filename,"wb");
        if (__stream == (FILE *)0x0) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"could not open PNG file for writing");
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar6 = png_create_write_struct("1.6.37",0,0);
        if (lVar6 == 0) {
          fclose(__stream);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"png_create_write_struct failed");
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar7 = png_create_info_struct(lVar6);
        if (lVar7 == 0) {
          fclose(__stream);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"png_create_info_struct failed");
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        p_Var8 = (__jmp_buf_tag *)png_set_longjmp_fn(lVar6,longjmp,200);
        iVar2 = _setjmp(p_Var8);
        if (iVar2 != 0) {
          fclose(__stream);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"error during init_io");
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        png_init_io(lVar6,__stream);
        p_Var8 = (__jmp_buf_tag *)png_set_longjmp_fn(lVar6,longjmp,200);
        iVar2 = _setjmp(p_Var8);
        if (iVar2 != 0) {
          fclose(__stream);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"error during writing PNG header");
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                          (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,0);
        rowPointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)sVar3;
        sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                          (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,1);
        rowPointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = (uint)sVar3;
        std::allocator<unsigned_char_*>::allocator((allocator<unsigned_char_*> *)((long)&y + 7));
        std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
                  ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)local_f0,
                   sVar3 & 0xffffffff,(allocator<unsigned_char_*> *)((long)&y + 7));
        std::allocator<unsigned_char_*>::~allocator((allocator<unsigned_char_*> *)((long)&y + 7));
        for (uStack_100 = 0;
            uStack_100 <
            (uint)rowPointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage; uStack_100 = uStack_100 + 1) {
          puVar9 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                             ((View<unsigned_char,false,std::allocator<unsigned_long>> *)in,0,
                              uStack_100);
          ppuVar10 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                               ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                                local_f0,uStack_100);
          *ppuVar10 = puVar9;
        }
        png_set_IHDR(lVar6,lVar7,
                     rowPointers.
                     super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (uint)rowPointers.
                           super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,8,0,0,0,0);
        png_write_info(lVar6,lVar7);
        p_Var8 = (__jmp_buf_tag *)png_set_longjmp_fn(lVar6,longjmp,200);
        iVar2 = _setjmp(p_Var8);
        if (iVar2 != 0) {
          fclose(__stream);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"Error during writing bytes");
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        ppuVar11 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::data
                             ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)local_f0)
        ;
        png_write_image(lVar6,ppuVar11);
        p_Var8 = (__jmp_buf_tag *)png_set_longjmp_fn(lVar6,longjmp,200);
        iVar2 = _setjmp(p_Var8);
        if (iVar2 != 0) {
          fclose(__stream);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"Error during end of write");
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        png_write_end(lVar6,0);
        fclose(__stream);
        std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector
                  ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)local_f0);
      }
      return;
    }
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"marray is too large for export to PNG");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
save(
    std::string const & fileName,
    Marray<unsigned char> const & in
) {
    if(in.dimension() != 2) {
        throw std::runtime_error("not implemented for Marray of dimension other than 2.");
    }
    if(in.shape(0) > std::numeric_limits<png_uint_32>::max()
    || in.shape(1) > std::numeric_limits<png_uint_32>::max()) {
        throw std::runtime_error("marray is too large for export to PNG");
    }
    if(in.coordinateOrder() == FirstMajorOrder) {
        Marray<unsigned char> tmp(in.shapeBegin(), in.shapeEnd(), LastMajorOrder);
        // note: tmp = in; would change in.coordinateOrder() which we do not want. thus:
        static_cast<andres::View<unsigned char, false> >(tmp) = in; // re-order in memory
        assert(tmp.coordinateOrder() == LastMajorOrder);
        save(fileName, tmp); // recurse!
        return;
    }

    assert(in.coordinateOrder() == LastMajorOrder);

    FILE *file = std::fopen(fileName.c_str(), "wb");
    if(!file) {
        throw std::runtime_error("could not open PNG file for writing");
    }
    png_structp png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, nullptr, nullptr, nullptr);
    if (!png_ptr) {
        fclose(file);
        throw std::runtime_error("png_create_write_struct failed");
    }
    png_infop info_ptr = png_create_info_struct(png_ptr);
    if (!info_ptr) {
        fclose(file);
        throw std::runtime_error("png_create_info_struct failed");
    }
    if(setjmp(png_jmpbuf(png_ptr))) {
        fclose(file);
        throw std::runtime_error("error during init_io");
    }
    png_init_io(png_ptr, file);
    if (setjmp(png_jmpbuf(png_ptr))) {
        fclose(file);
        throw std::runtime_error("error during writing PNG header");
    }

    png_uint_32 const width = static_cast<png_uint_32>(in.shape(0)); // bound has been checked before
    png_uint_32 const height = static_cast<png_uint_32>(in.shape(1)); // bound has been checked before
    std::vector<png_bytep> rowPointers(height);
    for(size_t y = 0; y < height; ++y) {
        rowPointers[y] = &in(0, y);
    }
    png_byte const color_type = PNG_COLOR_TYPE_GRAY;
    png_byte const bit_depth = 8;
    png_set_IHDR(
        png_ptr,
        info_ptr,
        width,
        height,
        bit_depth,
        color_type,
        PNG_INTERLACE_NONE,
        PNG_COMPRESSION_TYPE_BASE,
        PNG_FILTER_TYPE_BASE
    );
    png_write_info(png_ptr, info_ptr);
    // write bytes
    if (setjmp(png_jmpbuf(png_ptr))) {
        fclose(file);
        throw std::runtime_error("Error during writing bytes");
    }
    png_write_image(png_ptr, rowPointers.data());
    if (setjmp(png_jmpbuf(png_ptr))) {
        fclose(file);
        throw std::runtime_error("Error during end of write");
    }
    png_write_end(png_ptr, nullptr);
    fclose(file);
}